

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_discovery_peer.cpp
# Opt level: O0

void __thiscall udpdiscovery::impl::PeerEnv::ReceivingThreadFunc(PeerEnv *this)

{
  int __fd;
  uint16_t uVar1;
  uint32_t ip;
  void *__buf;
  size_t __n;
  ssize_t sVar2;
  long cur_time_ms;
  IpPort local_64;
  IpPort from;
  int length;
  string local_48 [8];
  string buffer;
  socklen_t local_24;
  undefined1 local_20 [4];
  AddressLenType addr_length;
  sockaddr_in from_addr;
  PeerEnv *this_local;
  
  from_addr.sin_zero = (uchar  [8])this;
  MinimalisticMutex::Lock(&this->lock_);
  this->ref_count_ = this->ref_count_ + 1;
  MinimalisticMutex::Unlock(&this->lock_);
  do {
    local_24 = 0x10;
    std::__cxx11::string::string(local_48);
    std::__cxx11::string::resize((ulong)local_48);
    __fd = this->binding_sock_;
    __buf = (void *)std::__cxx11::string::operator[]((ulong)local_48);
    __n = std::__cxx11::string::size();
    sVar2 = recvfrom(__fd,__buf,__n,0,(sockaddr *)local_20,&local_24);
    from.port_ = (int)sVar2;
    MinimalisticMutex::Lock(&this->lock_);
    if ((this->exit_ & 1U) == 0) {
      MinimalisticMutex::Unlock(&this->lock_);
      if (from.port_ < 1) {
        from.ip_ = 2;
      }
      else {
        IpPort::IpPort(&local_64);
        uVar1 = ntohs(local_20._2_2_);
        IpPort::set_port(&local_64,(uint)uVar1);
        ip = ntohl(addr_length);
        IpPort::set_ip(&local_64,ip);
        std::__cxx11::string::resize((ulong)local_48);
        cur_time_ms = NowTime();
        processReceivedBuffer(this,cur_time_ms,&local_64,(string *)local_48);
        from.ip_ = 0;
      }
    }
    else {
      decreaseRefCountAndMaybeDestroySelfAndUnlock(this);
      from.ip_ = 1;
    }
    std::__cxx11::string::~string(local_48);
  } while ((from.ip_ == 0) || (from.ip_ != 1));
  return;
}

Assistant:

void ReceivingThreadFunc() {
    lock_.Lock();
    ++ref_count_;
    lock_.Unlock();

    while (true) {
      sockaddr_in from_addr;
      AddressLenType addr_length = sizeof(sockaddr_in);

      std::string buffer;
      buffer.resize(kMaxPacketSize);

      int length = (int)recvfrom(binding_sock_, &buffer[0], buffer.size(), 0,
                                 (struct sockaddr*)&from_addr, &addr_length);

      lock_.Lock();
      if (exit_) {
        decreaseRefCountAndMaybeDestroySelfAndUnlock();
        return;
      }
      lock_.Unlock();

      if (length <= 0) {
        continue;
      }

      IpPort from;
      from.set_port(ntohs(from_addr.sin_port));
      from.set_ip(ntohl(from_addr.sin_addr.s_addr));

      buffer.resize(length);
      processReceivedBuffer(NowTime(), from, buffer);
    }
  }